

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O1

void __thiscall
wasm::ValueChildIterator::addChild(ValueChildIterator *this,Expression *parent,Expression **child)

{
  Id IVar1;
  Expression *pEVar2;
  Expression **local_10;
  Expression **child_local;
  
  IVar1 = parent->_id;
  if (((ulong)IVar1 < 0x36) && ((0x3000000000000eU >> ((ulong)IVar1 & 0x3f) & 1) != 0)) {
    pEVar2 = (Expression *)0x0;
    if (IVar1 == IfId) {
      pEVar2 = parent;
    }
    if (pEVar2 + 1 != (Expression *)child || IVar1 != IfId) {
      return;
    }
  }
  local_10 = child;
  SmallVector<wasm::Expression_**,_4UL>::push_back
            ((SmallVector<wasm::Expression_**,_4UL> *)this,&local_10);
  return;
}

Assistant:

void addChild(Expression* parent, Expression** child) {
    if (Properties::isControlFlowStructure(parent)) {
      // If conditions are the only value children of control flow structures
      if (auto* iff = parent->dynCast<If>()) {
        if (child == &iff->condition) {
          children.push_back(child);
        }
      }
    } else {
      // All children on non-control flow expressions are value children
      children.push_back(child);
    }
  }